

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_mul(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
                   _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *X;
  mbedtls_mpi *pmVar1;
  uchar swap;
  mbedtls_ecp_point *pmVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  mbedtls_ecp_point RP;
  mbedtls_mpi E;
  mbedtls_mpi B;
  mbedtls_mpi D;
  mbedtls_mpi BB;
  mbedtls_mpi DA;
  mbedtls_mpi C;
  mbedtls_mpi AA;
  mbedtls_mpi A;
  mbedtls_mpi PX;
  mbedtls_ecp_point local_188;
  mbedtls_mpi *local_140;
  mbedtls_ecp_point *local_138;
  mbedtls_mpi local_130;
  mbedtls_mpi local_118;
  mbedtls_mpi local_100;
  mbedtls_mpi local_e8;
  mbedtls_mpi *local_d0;
  size_t local_c8;
  mbedtls_mpi local_c0;
  mbedtls_mpi local_a8;
  mbedtls_mpi local_90;
  mbedtls_mpi local_78;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  iVar3 = mbedtls_mpi_cmp_int(&P->Z,1);
  iVar4 = -0x4f80;
  if ((((iVar3 == 0) && (local_138 = R, iVar4 = mbedtls_ecp_check_privkey(grp,m), iVar4 == 0)) &&
      (iVar4 = mbedtls_ecp_check_pubkey(grp,P), iVar4 == 0)) &&
     (iVar4 = -0x4f80, (grp->G).X.p != (mbedtls_mpi_uint *)0x0)) {
    if ((grp->G).Y.p != (mbedtls_mpi_uint *)0x0) {
      iVar4 = ecp_mul_comb(grp,local_138,m,P,f_rng,p_rng);
      return iVar4;
    }
    mbedtls_mpi_init(&local_188.X);
    mbedtls_mpi_init(&local_188.Y);
    mbedtls_mpi_init(&local_188.Z);
    mbedtls_mpi_init(&local_48);
    iVar4 = mbedtls_mpi_copy(&local_48,&P->X);
    if (((iVar4 == 0) && (iVar4 = mbedtls_ecp_copy(&local_188,P), pmVar2 = local_138, iVar4 == 0))
       && (iVar4 = mbedtls_mpi_lset(&local_138->X,1), iVar4 == 0)) {
      X = &pmVar2->Z;
      iVar4 = mbedtls_mpi_lset(X,0);
      if (iVar4 == 0) {
        mbedtls_mpi_free(&pmVar2->Y);
        pmVar1 = &grp->P;
        do {
          iVar4 = mbedtls_mpi_cmp_mpi(&local_188.X,pmVar1);
          if (iVar4 < 0) {
            local_140 = pmVar1;
            if ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
               (iVar4 = ecp_randomize_mxz(grp,&local_188,f_rng,p_rng), iVar4 == 0)) {
              sVar5 = mbedtls_mpi_bitlen(m);
              local_d0 = &grp->A;
              goto LAB_00168cf8;
            }
            break;
          }
          iVar4 = mbedtls_mpi_sub_abs(&local_188.X,&local_188.X,pmVar1);
        } while (iVar4 == 0);
      }
    }
LAB_00169412:
    mbedtls_mpi_free(&local_188.X);
    mbedtls_mpi_free(&local_188.Y);
    mbedtls_mpi_free(&local_188.Z);
    mbedtls_mpi_free(&local_48);
  }
  return iVar4;
LAB_00168cf8:
  if (sVar5 == 0) {
    iVar4 = ecp_normalize_mxz(grp,local_138);
    goto LAB_00169412;
  }
  local_c8 = sVar5 - 1;
  iVar4 = mbedtls_mpi_get_bit(m,sVar5 - 1);
  pmVar2 = local_138;
  swap = (uchar)iVar4;
  iVar4 = mbedtls_mpi_safe_cond_swap(&local_138->X,&local_188.X,swap);
  if ((iVar4 != 0) || (iVar4 = mbedtls_mpi_safe_cond_swap(X,&local_188.Z,swap), iVar4 != 0))
  goto LAB_00169412;
  mbedtls_mpi_init(&local_60);
  mbedtls_mpi_init(&local_78);
  mbedtls_mpi_init(&local_118);
  mbedtls_mpi_init(&local_e8);
  mbedtls_mpi_init(&local_130);
  mbedtls_mpi_init(&local_90);
  mbedtls_mpi_init(&local_100);
  mbedtls_mpi_init(&local_a8);
  mbedtls_mpi_init(&local_c0);
  iVar4 = mbedtls_mpi_add_mpi(&local_60,&pmVar2->X,X);
  pmVar1 = local_140;
  if (iVar4 == 0) {
    do {
      iVar4 = mbedtls_mpi_cmp_mpi(&local_60,pmVar1);
      if (iVar4 < 0) {
        iVar4 = mbedtls_mpi_mul_mpi(&local_78,&local_60,&local_60);
        if ((iVar4 == 0) && (iVar4 = ecp_modp(&local_78,grp), iVar4 == 0)) {
          mul_count = mul_count + 1;
          iVar4 = mbedtls_mpi_sub_mpi(&local_118,&local_138->X,X);
          goto joined_r0x00168f2a;
        }
        break;
      }
      iVar4 = mbedtls_mpi_sub_abs(&local_60,&local_60,pmVar1);
    } while (iVar4 == 0);
  }
LAB_00168e30:
  mbedtls_mpi_free(&local_60);
  mbedtls_mpi_free(&local_78);
  mbedtls_mpi_free(&local_118);
  mbedtls_mpi_free(&local_e8);
  mbedtls_mpi_free(&local_130);
  mbedtls_mpi_free(&local_90);
  mbedtls_mpi_free(&local_100);
  mbedtls_mpi_free(&local_a8);
  mbedtls_mpi_free(&local_c0);
  sVar5 = local_c8;
  if (((iVar4 != 0) ||
      (iVar4 = mbedtls_mpi_safe_cond_swap(&local_138->X,&local_188.X,swap), iVar4 != 0)) ||
     (iVar4 = mbedtls_mpi_safe_cond_swap(X,&local_188.Z,swap), iVar4 != 0)) goto LAB_00169412;
  goto LAB_00168cf8;
joined_r0x00168f2a:
  if (iVar4 != 0) goto LAB_00168e30;
  if ((-1 < local_118.s) || (iVar4 = mbedtls_mpi_cmp_int(&local_118,0), iVar4 == 0)) {
    iVar4 = mbedtls_mpi_mul_mpi(&local_e8,&local_118,&local_118);
    if ((iVar4 == 0) && (iVar4 = ecp_modp(&local_e8,grp), iVar4 == 0)) {
      mul_count = mul_count + 1;
      iVar4 = mbedtls_mpi_sub_mpi(&local_130,&local_78,&local_e8);
      goto joined_r0x00168fdd;
    }
    goto LAB_00168e30;
  }
  iVar4 = mbedtls_mpi_add_mpi(&local_118,&local_118,local_140);
  goto joined_r0x00168f2a;
joined_r0x00168fdd:
  if (iVar4 != 0) goto LAB_00168e30;
  if ((-1 < local_130.s) || (iVar4 = mbedtls_mpi_cmp_int(&local_130,0), iVar4 == 0)) {
    iVar4 = mbedtls_mpi_add_mpi(&local_90,&local_188.X,&local_188.Z);
    goto joined_r0x0016903f;
  }
  iVar4 = mbedtls_mpi_add_mpi(&local_130,&local_130,local_140);
  goto joined_r0x00168fdd;
joined_r0x0016903f:
  if (iVar4 != 0) goto LAB_00168e30;
  iVar4 = mbedtls_mpi_cmp_mpi(&local_90,local_140);
  if (iVar4 < 0) {
    iVar4 = mbedtls_mpi_sub_mpi(&local_100,&local_188.X,&local_188.Z);
    goto joined_r0x001690b8;
  }
  iVar4 = mbedtls_mpi_sub_abs(&local_90,&local_90,local_140);
  goto joined_r0x0016903f;
joined_r0x001690b8:
  if (iVar4 != 0) goto LAB_00168e30;
  if ((-1 < local_100.s) || (iVar4 = mbedtls_mpi_cmp_int(&local_100,0), iVar4 == 0)) {
    iVar4 = mbedtls_mpi_mul_mpi(&local_a8,&local_100,&local_60);
    if ((iVar4 == 0) && (iVar4 = ecp_modp(&local_a8,grp), iVar4 == 0)) {
      mul_count = mul_count + 1;
      iVar4 = mbedtls_mpi_mul_mpi(&local_c0,&local_90,&local_118);
      if ((iVar4 == 0) && (iVar4 = ecp_modp(&local_c0,grp), iVar4 == 0)) {
        mul_count = mul_count + 1;
        iVar4 = mbedtls_mpi_add_mpi(&local_188.X,&local_a8,&local_c0);
        if ((iVar4 == 0) && (iVar4 = ecp_modp(&local_188.X,grp), iVar4 == 0)) {
          mul_count = mul_count + 1;
          iVar4 = mbedtls_mpi_mul_mpi(&local_188.X,&local_188.X,&local_188.X);
          if ((iVar4 == 0) && (iVar4 = ecp_modp(&local_188.X,grp), iVar4 == 0)) {
            mul_count = mul_count + 1;
            iVar4 = mbedtls_mpi_sub_mpi(&local_188.Z,&local_a8,&local_c0);
            goto joined_r0x00169228;
          }
        }
      }
    }
    goto LAB_00168e30;
  }
  iVar4 = mbedtls_mpi_add_mpi(&local_100,&local_100,local_140);
  goto joined_r0x001690b8;
joined_r0x00169228:
  if (iVar4 != 0) goto LAB_00168e30;
  if ((-1 < local_188.Z.s) || (iVar4 = mbedtls_mpi_cmp_int(&local_188.Z,0), iVar4 == 0)) {
    pmVar1 = &local_188.Z;
    iVar4 = mbedtls_mpi_mul_mpi(pmVar1,pmVar1,pmVar1);
    if ((iVar4 == 0) && (iVar4 = ecp_modp(&local_188.Z,grp), iVar4 == 0)) {
      mul_count = mul_count + 1;
      iVar4 = mbedtls_mpi_mul_mpi(&local_188.Z,&local_48,&local_188.Z);
      if ((iVar4 == 0) && (iVar4 = ecp_modp(&local_188.Z,grp), iVar4 == 0)) {
        mul_count = mul_count + 1;
        iVar4 = mbedtls_mpi_mul_mpi(&local_138->X,&local_78,&local_e8);
        if ((iVar4 == 0) && (iVar4 = ecp_modp(&local_138->X,grp), iVar4 == 0)) {
          mul_count = mul_count + 1;
          iVar4 = mbedtls_mpi_mul_mpi(X,local_d0,&local_130);
          if ((iVar4 == 0) && (iVar4 = ecp_modp(X,grp), iVar4 == 0)) {
            mul_count = mul_count + 1;
            iVar4 = mbedtls_mpi_add_mpi(X,&local_e8,X);
            goto joined_r0x0016937a;
          }
        }
      }
    }
    goto LAB_00168e30;
  }
  iVar4 = mbedtls_mpi_add_mpi(&local_188.Z,&local_188.Z,local_140);
  goto joined_r0x00169228;
joined_r0x0016937a:
  if (iVar4 != 0) goto LAB_00168e30;
  iVar4 = mbedtls_mpi_cmp_mpi(X,local_140);
  if (iVar4 < 0) {
    iVar4 = mbedtls_mpi_mul_mpi(X,&local_130,X);
    if ((iVar4 == 0) && (iVar4 = ecp_modp(X,grp), iVar4 == 0)) {
      mul_count = mul_count + 1;
      iVar4 = 0;
    }
    goto LAB_00168e30;
  }
  iVar4 = mbedtls_mpi_sub_abs(X,X,local_140);
  goto joined_r0x0016937a;
}

Assistant:

int mbedtls_ecp_mul( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
             const mbedtls_mpi *m, const mbedtls_ecp_point *P,
             int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret;

    /* Common sanity checks */
    if( mbedtls_mpi_cmp_int( &P->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecp_check_privkey( grp, m ) ) != 0 ||
        ( ret = mbedtls_ecp_check_pubkey( grp, P ) ) != 0 )
        return( ret );

#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
        return( ecp_mul_mxz( grp, R, m, P, f_rng, p_rng ) );
#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
        return( ecp_mul_comb( grp, R, m, P, f_rng, p_rng ) );
#endif
    return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
}